

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int uv__tcp_connect(uv_connect_t *req,uv_tcp_t *handle,sockaddr *addr,uint addrlen,uv_connect_cb cb)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int r;
  int err;
  uv_connect_cb cb_local;
  uint addrlen_local;
  sockaddr *addr_local;
  uv_tcp_t *handle_local;
  uv_connect_t *req_local;
  
  if (handle->type != UV_TCP) {
    __assert_fail("handle->type == UV_TCP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/tcp.c"
                  ,0xd5,
                  "int uv__tcp_connect(uv_connect_t *, uv_tcp_t *, const struct sockaddr *, unsigned int, uv_connect_cb)"
                 );
  }
  if (handle->connect_req == (uv_connect_t *)0x0) {
    if (handle->delayed_error == 0) {
      iVar1 = maybe_new_socket(handle,(uint)addr->sa_family,0xc000);
      if (iVar1 != 0) {
        return iVar1;
      }
      do {
        piVar2 = __errno_location();
        *piVar2 = 0;
        iVar1 = connect((handle->io_watcher).fd,(sockaddr *)addr,addrlen);
        bVar3 = false;
        if (iVar1 == -1) {
          piVar2 = __errno_location();
          bVar3 = *piVar2 == 4;
        }
      } while (bVar3);
      if (((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 0)) &&
         (piVar2 = __errno_location(), *piVar2 != 0x73)) {
        piVar2 = __errno_location();
        if (*piVar2 != 0x6f) {
          piVar2 = __errno_location();
          return -*piVar2;
        }
        handle->delayed_error = -0x6f;
      }
    }
    req->type = UV_CONNECT;
    (handle->loop->active_reqs).count = (handle->loop->active_reqs).count + 1;
    req->cb = cb;
    req->handle = (uv_stream_t *)handle;
    req->queue[0] = req->queue;
    req->queue[1] = req->queue;
    handle->connect_req = req;
    uv__io_start(handle->loop,&handle->io_watcher,4);
    if (handle->delayed_error != 0) {
      uv__io_feed(handle->loop,&handle->io_watcher);
    }
    req_local._4_4_ = 0;
  }
  else {
    req_local._4_4_ = -0x72;
  }
  return req_local._4_4_;
}

Assistant:

int uv__tcp_connect(uv_connect_t* req,
                    uv_tcp_t* handle,
                    const struct sockaddr* addr,
                    unsigned int addrlen,
                    uv_connect_cb cb) {
  int err;
  int r;

  assert(handle->type == UV_TCP);

  if (handle->connect_req != NULL)
    return UV_EALREADY;  /* FIXME(bnoordhuis) UV_EINVAL or maybe UV_EBUSY. */

  if (handle->delayed_error != 0)
    goto out;

  err = maybe_new_socket(handle,
                         addr->sa_family,
                         UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
  if (err)
    return err;

  do {
    errno = 0;
    r = connect(uv__stream_fd(handle), addr, addrlen);
  } while (r == -1 && errno == EINTR);

  /* We not only check the return value, but also check the errno != 0.
   * Because in rare cases connect() will return -1 but the errno
   * is 0 (for example, on Android 4.3, OnePlus phone A0001_12_150227)
   * and actually the tcp three-way handshake is completed.
   */
  if (r == -1 && errno != 0) {
    if (errno == EINPROGRESS)
      ; /* not an error */
    else if (errno == ECONNREFUSED
#if defined(__OpenBSD__)
      || errno == EINVAL
#endif
      )
    /* If we get ECONNREFUSED (Solaris) or EINVAL (OpenBSD) wait until the
     * next tick to report the error. Solaris and OpenBSD wants to report
     * immediately -- other unixes want to wait.
     */
      handle->delayed_error = UV__ERR(ECONNREFUSED);
    else
      return UV__ERR(errno);
  }

out:

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->cb = cb;
  req->handle = (uv_stream_t*) handle;
  QUEUE_INIT(&req->queue);
  handle->connect_req = req;

  uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);

  if (handle->delayed_error)
    uv__io_feed(handle->loop, &handle->io_watcher);

  return 0;
}